

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

uint32_t __thiscall
absl::lts_20250127::strings_internal::BigUnsigned<4>::DivMod<10u>(BigUnsigned<4> *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int local_1c;
  ulong uStack_18;
  int i;
  uint64_t accumulator;
  BigUnsigned<4> *this_local;
  
  uStack_18 = 0;
  local_1c = this->size_;
  while (local_1c = local_1c + -1, -1 < local_1c) {
    uStack_18 = (ulong)this->words_[local_1c] + (uStack_18 << 0x20);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uStack_18;
    this->words_[local_1c] = SUB164(auVar1 / ZEXT816(10),0);
    uStack_18 = uStack_18 % 10;
  }
  while( true ) {
    bVar2 = false;
    if (0 < this->size_) {
      bVar2 = this->words_[this->size_ + -1] == 0;
    }
    if (!bVar2) break;
    this->size_ = this->size_ + -1;
  }
  return (uint32_t)uStack_18;
}

Assistant:

uint32_t DivMod() {
    uint64_t accumulator = 0;
    for (int i = size_ - 1; i >= 0; --i) {
      accumulator <<= 32;
      accumulator += words_[i];
      // accumulator / divisor will never overflow an int32_t in this loop
      words_[i] = static_cast<uint32_t>(accumulator / divisor);
      accumulator = accumulator % divisor;
    }
    while (size_ > 0 && words_[size_ - 1] == 0) {
      --size_;
    }
    return static_cast<uint32_t>(accumulator);
  }